

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O3

iterator __thiscall
pstore::romfs::directory::find(directory *this,not_null<const_char_*> name,size_t length)

{
  pointer pvVar1;
  char *__s1;
  ulong uVar2;
  int iVar3;
  pointer pvVar4;
  difference_type __d;
  ulong uVar5;
  
  pvVar4 = (this->members_).ptr_;
  pvVar1 = pvVar4 + this->size_;
  uVar5 = this->size_;
  while (uVar2 = uVar5, 0 < (long)uVar2) {
    uVar5 = uVar2 >> 1;
    iVar3 = strncmp(pvVar4[uVar5].name_.ptr_,name.ptr_,length);
    if (iVar3 < 0) {
      pvVar4 = pvVar4 + uVar5 + 1;
      uVar5 = ~uVar5 + uVar2;
    }
  }
  if (pvVar4 != pvVar1) {
    __s1 = (pvVar4->name_).ptr_;
    iVar3 = strncmp(__s1,name.ptr_,length);
    if ((iVar3 == 0) && (__s1[length] == '\0')) {
      return (iterator)pvVar4;
    }
  }
  return (iterator)pvVar1;
}

Assistant:

auto directory::find (gsl::not_null<char const *> const name, std::size_t length) const
            -> iterator {

            // Directories are sorted by name: we can use a binary search here.
            auto const end = this->end ();
            auto const it = std::lower_bound (
                this->begin (), end, std::make_pair (name, length),
                [] (dirent const & a,
                    std::pair<gsl::not_null<char const *>, std::size_t> const & b) {
                    return std::strncmp (a.name (), b.first, b.second) < 0;
                });
            if (it != end) {
                gsl::czstring const n = it->name ();
                if (std::strncmp (n, name, length) == 0 && n[length] == '\0') {
                    return it;
                }
            }
            return end;
        }